

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_mandatory.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ulong local_28;
  size_t i;
  rfc5444_writer_message *msg;
  char **argv_local;
  int argc_local;
  
  abuf_init(&dumpbuf);
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    tlv_value_buffer[local_28] = (uint8_t)local_28;
  }
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&small_if);
  rfc5444_writer_register_target(&writer,&large_if);
  lVar2 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar2 + 0xd8) = addMessageHeader;
  *(code **)(lVar2 + 0xe0) = finishMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,1);
  BEGIN_TESTING(clear_elements);
  test_frag_80_1();
  test_frag_80_2();
  test_frag_50_3();
  rfc5444_writer_cleanup(&writer);
  abuf_free(&dumpbuf);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;
  size_t i;

  abuf_init(&dumpbuf);

  for (i=0; i<sizeof(tlv_value_buffer); i++) {
    tlv_value_buffer[i] = i;
  }

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &small_if);
  rfc5444_writer_register_target(&writer, &large_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;
  msg->finishMessageHeader = finishMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test_frag_80_1();
  test_frag_80_2();
  test_frag_50_3();

  rfc5444_writer_cleanup(&writer);

  abuf_free(&dumpbuf);
  return FINISH_TESTING();
}